

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_avx2.c
# Opt level: O1

int64_t aom_sse_avx2(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  undefined1 auVar1 [32];
  int iVar2;
  long lVar3;
  undefined1 (*pauVar4) [32];
  long lVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  int iVar8;
  undefined1 (*pauVar9) [32];
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  uint8_t *puVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  
  if (width < 0x20) {
    if (width == 4) {
      lVar3 = (long)a_stride;
      lVar5 = (long)b_stride;
      iVar10 = 0;
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar24 = vpinsrd_avx(ZEXT416(*(uint *)a),*(undefined4 *)((long)a + lVar3),1);
        auVar32 = vpinsrd_avx(ZEXT416(*(uint *)((long)a + lVar3 * 2)),
                              *(undefined4 *)((long)a + lVar3 * 3),1);
        auVar33 = vpunpcklqdq_avx(auVar24,auVar32);
        auVar24 = vpinsrd_avx(ZEXT416(*(uint *)b),*(undefined4 *)((long)b + lVar5),1);
        auVar32 = vpinsrd_avx(ZEXT416(*(uint *)((long)b + lVar5 * 2)),
                              *(undefined4 *)((long)b + lVar5 * 3),1);
        auVar24 = vpunpcklqdq_avx(auVar24,auVar32);
        auVar20 = vpmovzxbw_avx2(auVar33);
        auVar36 = vpmovzxbw_avx2(auVar24);
        auVar20 = vpsubw_avx2(auVar20,auVar36);
        auVar20 = vpmaddwd_avx2(auVar20,auVar20);
        auVar20 = vpaddd_avx2(auVar20,auVar21._0_32_);
        auVar21 = ZEXT3264(auVar20);
        a = (uint8_t *)((long)a + (long)(a_stride << 2));
        b = (uint8_t *)((long)b + (long)(b_stride << 2));
        iVar10 = iVar10 + 4;
      } while (iVar10 < height);
      goto LAB_0036d006;
    }
    if (width == 8) {
      iVar10 = 0;
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)((long)a + (long)a_stride);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)a;
        auVar24 = vpunpcklqdq_avx(auVar32,auVar24);
        auVar20 = vpmovzxbw_avx2(auVar24);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)((long)b + (long)b_stride);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)b;
        auVar24 = vpunpcklqdq_avx(auVar39,auVar33);
        auVar36 = vpmovzxbw_avx2(auVar24);
        auVar20 = vpsubw_avx2(auVar20,auVar36);
        auVar20 = vpmaddwd_avx2(auVar20,auVar20);
        auVar20 = vpaddd_avx2(auVar20,auVar21._0_32_);
        auVar21 = ZEXT3264(auVar20);
        a = (uint8_t *)((long)a + (long)(a_stride * 2));
        b = (uint8_t *)((long)b + (long)(b_stride * 2));
        iVar10 = iVar10 + 2;
      } while (iVar10 < height);
      goto LAB_0036d006;
    }
    if (width == 0x10) {
      iVar10 = 0;
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar36._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])a + a_stride) +
             ZEXT116(1) * *(undefined1 (*) [16])a;
        auVar36._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])a + a_stride);
        auVar41._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])b + b_stride) +
             ZEXT116(1) * *(undefined1 (*) [16])b;
        auVar41._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])b + b_stride);
        auVar26 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar20 = vpunpcklbw_avx2(auVar36,auVar26);
        auVar36 = vpunpckhbw_avx2(auVar36,auVar26);
        auVar1 = vpunpcklbw_avx2(auVar41,auVar26);
        auVar20 = vpsubw_avx2(auVar20,auVar1);
        auVar1 = vpunpckhbw_avx2(auVar41,auVar26);
        auVar36 = vpsubw_avx2(auVar36,auVar1);
        auVar20 = vpmaddwd_avx2(auVar20,auVar20);
        auVar20 = vpaddd_avx2(auVar20,auVar21._0_32_);
        auVar36 = vpmaddwd_avx2(auVar36,auVar36);
        auVar20 = vpaddd_avx2(auVar20,auVar36);
        auVar21 = ZEXT3264(auVar20);
        a = *(undefined1 (*) [16])a + a_stride * 2;
        b = *(undefined1 (*) [16])b + b_stride * 2;
        iVar10 = iVar10 + 2;
      } while (iVar10 < height);
      goto LAB_0036d006;
    }
  }
  else {
    if (width == 0x20) {
      iVar10 = 1;
      if (1 < height) {
        iVar10 = height;
      }
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar26 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar20 = vpunpcklbw_avx2(*(undefined1 (*) [32])a,auVar26);
        auVar36 = vpunpckhbw_avx2(*(undefined1 (*) [32])a,auVar26);
        auVar1 = vpunpcklbw_avx2(*(undefined1 (*) [32])b,auVar26);
        auVar20 = vpsubw_avx2(auVar20,auVar1);
        auVar1 = vpunpckhbw_avx2(*(undefined1 (*) [32])b,auVar26);
        auVar36 = vpsubw_avx2(auVar36,auVar1);
        auVar20 = vpmaddwd_avx2(auVar20,auVar20);
        auVar20 = vpaddd_avx2(auVar20,auVar21._0_32_);
        auVar36 = vpmaddwd_avx2(auVar36,auVar36);
        auVar20 = vpaddd_avx2(auVar20,auVar36);
        auVar21 = ZEXT3264(auVar20);
        a = *(undefined1 (*) [32])a + a_stride;
        b = *(undefined1 (*) [32])b + b_stride;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      goto LAB_0036d006;
    }
    if (width == 0x40) {
      iVar10 = 1;
      if (1 < height) {
        iVar10 = height;
      }
      pauVar4 = (undefined1 (*) [32])(b + 0x20);
      pauVar9 = (undefined1 (*) [32])(a + 0x20);
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar27 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar20 = vpunpcklbw_avx2(pauVar9[-1],auVar27);
        auVar36 = vpunpckhbw_avx2(pauVar9[-1],auVar27);
        auVar1 = vpunpcklbw_avx2(pauVar4[-1],auVar27);
        auVar20 = vpsubw_avx2(auVar20,auVar1);
        auVar1 = vpunpckhbw_avx2(pauVar4[-1],auVar27);
        auVar36 = vpsubw_avx2(auVar36,auVar1);
        auVar20 = vpmaddwd_avx2(auVar20,auVar20);
        auVar20 = vpaddd_avx2(auVar20,auVar21._0_32_);
        auVar36 = vpmaddwd_avx2(auVar36,auVar36);
        auVar1 = vpunpcklbw_avx2(*pauVar9,auVar27);
        auVar26 = vpunpckhbw_avx2(*pauVar9,auVar27);
        auVar41 = vpunpcklbw_avx2(*pauVar4,auVar27);
        auVar1 = vpsubw_avx2(auVar1,auVar41);
        auVar41 = vpunpckhbw_avx2(*pauVar4,auVar27);
        auVar26 = vpsubw_avx2(auVar26,auVar41);
        auVar1 = vpmaddwd_avx2(auVar1,auVar1);
        auVar36 = vpaddd_avx2(auVar36,auVar1);
        auVar20 = vpaddd_avx2(auVar20,auVar36);
        auVar36 = vpmaddwd_avx2(auVar26,auVar26);
        auVar20 = vpaddd_avx2(auVar20,auVar36);
        auVar21 = ZEXT3264(auVar20);
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + b_stride);
        pauVar9 = (undefined1 (*) [32])(*pauVar9 + a_stride);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      goto LAB_0036d006;
    }
    if (width == 0x80) {
      iVar10 = 1;
      if (1 < height) {
        iVar10 = height;
      }
      pauVar4 = (undefined1 (*) [32])(b + 0x60);
      pauVar9 = (undefined1 (*) [32])(a + 0x60);
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar27 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar20 = vpunpcklbw_avx2(pauVar9[-3],auVar27);
        auVar36 = vpunpckhbw_avx2(pauVar9[-3],auVar27);
        auVar1 = vpunpcklbw_avx2(pauVar4[-3],auVar27);
        auVar20 = vpsubw_avx2(auVar20,auVar1);
        auVar1 = vpunpckhbw_avx2(pauVar4[-3],auVar27);
        auVar36 = vpsubw_avx2(auVar36,auVar1);
        auVar20 = vpmaddwd_avx2(auVar20,auVar20);
        auVar20 = vpaddd_avx2(auVar20,auVar21._0_32_);
        auVar36 = vpmaddwd_avx2(auVar36,auVar36);
        auVar1 = vpunpcklbw_avx2(pauVar9[-2],auVar27);
        auVar26 = vpunpckhbw_avx2(pauVar9[-2],auVar27);
        auVar41 = vpunpcklbw_avx2(pauVar4[-2],auVar27);
        auVar1 = vpsubw_avx2(auVar1,auVar41);
        auVar41 = vpunpckhbw_avx2(pauVar4[-2],auVar27);
        auVar26 = vpsubw_avx2(auVar26,auVar41);
        auVar1 = vpmaddwd_avx2(auVar1,auVar1);
        auVar36 = vpaddd_avx2(auVar36,auVar1);
        auVar20 = vpaddd_avx2(auVar20,auVar36);
        auVar36 = vpmaddwd_avx2(auVar26,auVar26);
        auVar1 = vpunpcklbw_avx2(pauVar9[-1],auVar27);
        auVar26 = vpunpckhbw_avx2(pauVar9[-1],auVar27);
        auVar41 = vpunpcklbw_avx2(pauVar4[-1],auVar27);
        auVar1 = vpsubw_avx2(auVar1,auVar41);
        auVar41 = vpunpckhbw_avx2(pauVar4[-1],auVar27);
        auVar26 = vpsubw_avx2(auVar26,auVar41);
        auVar1 = vpmaddwd_avx2(auVar1,auVar1);
        auVar36 = vpaddd_avx2(auVar36,auVar1);
        auVar1 = vpmaddwd_avx2(auVar26,auVar26);
        auVar36 = vpaddd_avx2(auVar36,auVar1);
        auVar20 = vpaddd_avx2(auVar20,auVar36);
        auVar36 = vpunpcklbw_avx2(*pauVar9,auVar27);
        auVar1 = vpunpckhbw_avx2(*pauVar9,auVar27);
        auVar26 = vpunpcklbw_avx2(*pauVar4,auVar27);
        auVar36 = vpsubw_avx2(auVar36,auVar26);
        auVar26 = vpunpckhbw_avx2(*pauVar4,auVar27);
        auVar1 = vpsubw_avx2(auVar1,auVar26);
        auVar36 = vpmaddwd_avx2(auVar36,auVar36);
        auVar1 = vpmaddwd_avx2(auVar1,auVar1);
        auVar36 = vpaddd_avx2(auVar36,auVar1);
        auVar20 = vpaddd_avx2(auVar20,auVar36);
        auVar21 = ZEXT3264(auVar20);
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + b_stride);
        pauVar9 = (undefined1 (*) [32])(*pauVar9 + a_stride);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      goto LAB_0036d006;
    }
  }
  lVar3 = (long)(b_stride * 2);
  if ((width & 7U) == 0) {
    puVar16 = b + b_stride;
    puVar7 = a + a_stride;
    iVar10 = 0;
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    do {
      lVar5 = 0;
      do {
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(ulong *)(puVar7 + lVar5);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)(a + lVar5);
        auVar24 = vpunpcklqdq_avx(auVar34,auVar25);
        auVar20 = vpmovzxbw_avx2(auVar24);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)(puVar16 + lVar5);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)(b + lVar5);
        auVar24 = vpunpcklqdq_avx(auVar40,auVar35);
        auVar36 = vpmovzxbw_avx2(auVar24);
        auVar20 = vpsubw_avx2(auVar20,auVar36);
        auVar20 = vpmaddwd_avx2(auVar20,auVar20);
        auVar20 = vpaddd_avx2(auVar20,auVar21._0_32_);
        auVar21 = ZEXT3264(auVar20);
        lVar5 = lVar5 + 8;
      } while (lVar5 < width);
      a = a + a_stride * 2;
      b = b + lVar3;
      iVar10 = iVar10 + 2;
      puVar16 = puVar16 + lVar3;
      puVar7 = puVar7 + a_stride * 2;
    } while (iVar10 < height);
  }
  else {
    lVar13 = (long)a_stride;
    lVar5 = (long)b_stride;
    lVar12 = (long)(a_stride * 2);
    iVar8 = a_stride << 2;
    iVar10 = b_stride << 2;
    puVar16 = b + lVar5;
    puVar17 = b + lVar3 + lVar5;
    puVar7 = b + lVar3;
    puVar18 = a + lVar13;
    puVar19 = a + lVar12 + lVar13;
    puVar6 = a + lVar12;
    iVar11 = 0;
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    do {
      uVar14 = 0;
      do {
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)(puVar18 + uVar14);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)(a + uVar14);
        auVar24 = vpunpcklqdq_avx(auVar28,auVar22);
        auVar20 = vpmovzxbw_avx2(auVar24);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(puVar16 + uVar14);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)(b + uVar14);
        auVar24 = vpunpcklqdq_avx(auVar37,auVar29);
        auVar36 = vpmovzxbw_avx2(auVar24);
        auVar20 = vpsubw_avx2(auVar20,auVar36);
        auVar20 = vpmaddwd_avx2(auVar20,auVar20);
        auVar20 = vpaddd_avx2(auVar20,auVar21._0_32_);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(puVar19 + uVar14);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(puVar6 + uVar14);
        auVar24 = vpunpcklqdq_avx(auVar30,auVar23);
        auVar36 = vpmovzxbw_avx2(auVar24);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)(puVar17 + uVar14);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)(puVar7 + uVar14);
        auVar24 = vpunpcklqdq_avx(auVar38,auVar31);
        auVar1 = vpmovzxbw_avx2(auVar24);
        auVar36 = vpsubw_avx2(auVar36,auVar1);
        auVar36 = vpmaddwd_avx2(auVar36,auVar36);
        auVar20 = vpaddd_avx2(auVar20,auVar36);
        auVar21 = ZEXT3264(auVar20);
        uVar15 = uVar14 + 8;
        iVar2 = (int)uVar14;
        uVar14 = uVar15;
      } while (iVar2 + 0xc < width);
      uVar15 = uVar15 & 0xffffffff;
      auVar24 = vpinsrd_avx(ZEXT416(*(uint *)(a + uVar15)),*(undefined4 *)(a + lVar13 + uVar15),1);
      auVar32 = vpinsrd_avx(ZEXT416(*(uint *)(a + lVar12 + uVar15)),
                            *(undefined4 *)(a + lVar13 * 3 + uVar15),1);
      auVar33 = vpinsrd_avx(ZEXT416(*(uint *)(b + uVar15)),*(undefined4 *)(b + lVar5 + uVar15),1);
      auVar39 = vpinsrd_avx(ZEXT416(*(uint *)(b + lVar3 + uVar15)),
                            *(undefined4 *)(b + lVar5 * 3 + uVar15),1);
      auVar24 = vpunpcklqdq_avx(auVar24,auVar32);
      auVar32 = vpunpcklqdq_avx(auVar33,auVar39);
      auVar36 = vpmovzxbw_avx2(auVar24);
      auVar1 = vpmovzxbw_avx2(auVar32);
      auVar36 = vpsubw_avx2(auVar36,auVar1);
      auVar36 = vpmaddwd_avx2(auVar36,auVar36);
      auVar20 = vpaddd_avx2(auVar36,auVar20);
      auVar21 = ZEXT3264(auVar20);
      a = a + iVar8;
      b = b + iVar10;
      iVar11 = iVar11 + 4;
      puVar16 = puVar16 + iVar10;
      puVar17 = puVar17 + iVar10;
      puVar7 = puVar7 + iVar10;
      puVar18 = puVar18 + iVar8;
      puVar19 = puVar19 + iVar8;
      puVar6 = puVar6 + iVar8;
    } while (iVar11 < height);
  }
LAB_0036d006:
  auVar36 = vpunpckldq_avx2(auVar20,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  auVar20 = vpunpckhdq_avx2(auVar20,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  auVar20 = vpaddq_avx2(auVar36,auVar20);
  auVar24 = vpaddq_avx(auVar20._0_16_,auVar20._16_16_);
  auVar32 = vpshufd_avx(auVar24,0xee);
  auVar24 = vpaddq_avx(auVar24,auVar32);
  return auVar24._0_8_;
}

Assistant:

int64_t aom_sse_avx2(const uint8_t *a, int a_stride, const uint8_t *b,
                     int b_stride, int width, int height) {
  int32_t y = 0;
  int64_t sse = 0;
  __m256i sum = _mm256_setzero_si256();
  __m256i zero = _mm256_setzero_si256();
  switch (width) {
    case 4:
      do {
        sse_w4x4_avx2(a, a_stride, b, b_stride, &sum);
        a += a_stride << 2;
        b += b_stride << 2;
        y += 4;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 8:
      do {
        sse_w8x2_avx2(a, a_stride, b, b_stride, &sum);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 16:
      do {
        const __m128i v_a0 = xx_loadu_128(a);
        const __m128i v_a1 = xx_loadu_128(a + a_stride);
        const __m128i v_b0 = xx_loadu_128(b);
        const __m128i v_b1 = xx_loadu_128(b + b_stride);
        const __m256i v_a =
            _mm256_insertf128_si256(_mm256_castsi128_si256(v_a0), v_a1, 0x01);
        const __m256i v_b =
            _mm256_insertf128_si256(_mm256_castsi128_si256(v_b0), v_b1, 0x01);
        const __m256i v_al = _mm256_unpacklo_epi8(v_a, zero);
        const __m256i v_au = _mm256_unpackhi_epi8(v_a, zero);
        const __m256i v_bl = _mm256_unpacklo_epi8(v_b, zero);
        const __m256i v_bu = _mm256_unpackhi_epi8(v_b, zero);
        const __m256i v_asub = _mm256_sub_epi16(v_al, v_bl);
        const __m256i v_bsub = _mm256_sub_epi16(v_au, v_bu);
        const __m256i temp =
            _mm256_add_epi32(_mm256_madd_epi16(v_asub, v_asub),
                             _mm256_madd_epi16(v_bsub, v_bsub));
        sum = _mm256_add_epi32(sum, temp);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 32:
      do {
        sse_w32_avx2(&sum, a, b);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 64:
      do {
        sse_w32_avx2(&sum, a, b);
        sse_w32_avx2(&sum, a + 32, b + 32);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 128:
      do {
        sse_w32_avx2(&sum, a, b);
        sse_w32_avx2(&sum, a + 32, b + 32);
        sse_w32_avx2(&sum, a + 64, b + 64);
        sse_w32_avx2(&sum, a + 96, b + 96);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    default:
      if ((width & 0x07) == 0) {
        do {
          int i = 0;
          do {
            sse_w8x2_avx2(a + i, a_stride, b + i, b_stride, &sum);
            i += 8;
          } while (i < width);
          a += a_stride << 1;
          b += b_stride << 1;
          y += 2;
        } while (y < height);
      } else {
        do {
          int i = 0;
          do {
            sse_w8x2_avx2(a + i, a_stride, b + i, b_stride, &sum);
            const uint8_t *a2 = a + i + (a_stride << 1);
            const uint8_t *b2 = b + i + (b_stride << 1);
            sse_w8x2_avx2(a2, a_stride, b2, b_stride, &sum);
            i += 8;
          } while (i + 4 < width);
          sse_w4x4_avx2(a + i, a_stride, b + i, b_stride, &sum);
          a += a_stride << 2;
          b += b_stride << 2;
          y += 4;
        } while (y < height);
      }
      sse = summary_all_avx2(&sum);
      break;
  }

  return sse;
}